

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  char cVar1;
  CImgArgumentException *this_00;
  long lVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  char cVar15;
  ulong uVar16;
  uint *puVar17;
  long lVar18;
  CImg<unsigned_int> res;
  
  puVar17 = this->_data;
  if (((this->_depth == 0 || this->_height == 0) || (this->_width == 0 || puVar17 == (uint *)0x0))
     || (uVar9 = this->_spectrum, permut == (char *)0x0 || uVar9 == 0)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xyzc"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) {
        lVar2 = 0;
        goto LAB_00130f00;
      }
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  CImg(__return_storage_ptr__,this,false);
  goto LAB_00132a35;
  while (lVar2 = lVar2 + 1, (int)lVar2 != 4) {
LAB_00130f00:
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xycz"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131005;
      break;
    }
  }
  assign(&res,this->_width,this->_height,uVar9,this->_depth);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            iVar13 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar5 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar6 +
                            (ulong)(res._width * iVar13 + iVar10)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_00131005:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xzyc"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131119;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_width,this->_depth,this->_height,uVar9);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar5 +
                            lVar2 * lVar6 + (ulong)(res._width * iVar13 + iVar10)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_00131119:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xzcy"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_0013122c;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_width,this->_depth,uVar9,this->_height);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar5 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar6 +
                            (ulong)(res._width * iVar13 + iVar10)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_0013122c:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xcyz"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_0013133c;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_width,uVar9,this->_height,this->_depth);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar5 +
                            lVar2 * lVar6 + (ulong)(res._width * iVar13 + iVar10)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_0013133c:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "xczy"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_0013144c;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_width,uVar9,this->_depth,this->_height);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar5 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar6 +
                            (ulong)(res._width * iVar13 + iVar10)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_0013144c:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yxzc"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131560;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_height,this->_width,this->_depth,uVar9);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            iVar13 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar6 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar5 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_00131560:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yxcz"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131676;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_height,this->_width,uVar9,this->_depth);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            iVar13 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar5 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar6 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_00131676:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yzxc"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131785;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_height,this->_depth,this->_width,uVar9);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
    } while (lVar6 < (int)uVar9);
  }
LAB_00131785:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yzcx"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131963;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_height,this->_depth,uVar9,this->_width);
  uVar16 = (ulong)this->_width;
  switch(this->_width) {
  case 1:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      lVar2 = 0;
      do {
        uVar9 = *puVar17;
        puVar17 = puVar17 + 1;
        res._data[lVar2] = uVar9;
        lVar2 = lVar2 + 1;
      } while (iVar13 != (int)lVar2);
    }
    break;
  case 2:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      lVar2 = 0;
      do {
        res._data[lVar2] = *puVar17;
        puVar7 = puVar17 + 1;
        puVar17 = puVar17 + 2;
        res._data[(res._8_8_ & 0xffffffff) * (res._0_8_ & 0xffffffff) * (ulong)res._height + lVar2]
             = *puVar7;
        lVar2 = lVar2 + 1;
      } while (iVar13 != (int)lVar2);
    }
    break;
  case 3:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      lVar2 = (res._8_8_ & 0xffffffff) * (res._0_8_ & 0xffffffff) * (ulong)res._height;
      lVar5 = 0;
      do {
        res._data[lVar5] = *puVar17;
        res._data[lVar2 + lVar5] = puVar17[1];
        puVar7 = puVar17 + 2;
        puVar17 = puVar17 + 3;
        res._data[lVar2 * 2 + lVar5] = *puVar7;
        lVar5 = lVar5 + 1;
      } while (iVar13 != (int)lVar5);
    }
    break;
  case 4:
    iVar13 = this->_depth * this->_height * this->_spectrum;
    if (iVar13 != 0) {
      lVar2 = (res._8_8_ & 0xffffffff) * (res._0_8_ & 0xffffffff) * (ulong)res._height;
      lVar5 = 0;
      do {
        res._data[lVar5] = *puVar17;
        res._data[lVar2 + lVar5] = puVar17[1];
        res._data[lVar2 * 2 + lVar5] = puVar17[2];
        puVar7 = puVar17 + 3;
        puVar17 = puVar17 + 4;
        res._data[lVar2 * 3 + lVar5] = *puVar7;
        lVar5 = lVar5 + 1;
      } while (iVar13 != (int)lVar5);
    }
    break;
  default:
    uVar9 = this->_spectrum;
    if (0 < (int)uVar9) {
      lVar2 = (ulong)res._height * (res._0_8_ & 0xffffffff);
      uVar8 = this->_depth;
      lVar5 = 0;
      lVar6 = 0;
      do {
        if (0 < (int)uVar8) {
          uVar9 = this->_height;
          iVar13 = 0;
          do {
            if (0 < (int)uVar9) {
              iVar10 = 0;
              do {
                if (0 < (int)uVar16) {
                  lVar18 = 0;
                  lVar4 = 0;
                  lVar11 = (long)res._data + lVar5;
                  do {
                    *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                    lVar4 = lVar4 + 1;
                    uVar16 = (ulong)(int)this->_width;
                    lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                    lVar18 = lVar18 + 4;
                  } while (lVar4 < (long)uVar16);
                  uVar9 = this->_height;
                  puVar17 = (uint *)((long)puVar17 + lVar18);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (int)uVar9);
              uVar8 = this->_depth;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < (int)uVar8);
          uVar9 = this->_spectrum;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + lVar2 * 4;
      } while (lVar6 < (int)uVar9);
    }
    CImg(__return_storage_ptr__,&res);
    goto LAB_00132a35;
  }
LAB_00131963:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "ycxz"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131a6f;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_height,this->_spectrum,this->_width,this->_depth);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_00131a6f:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "yczx"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131b7f;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_height,this->_spectrum,this->_depth,this->_width);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar13 + iVar10) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + lVar2 * 4;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_00131b7f:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zxyc"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131c8e;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_depth,this->_width,this->_height,this->_spectrum);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar5 +
                            lVar2 * lVar6 + (ulong)(res._width * iVar10 + iVar13)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_00131c8e:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zxcy"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131d9d;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_depth,this->_width,this->_spectrum,this->_height);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar5 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar6 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar9);
  }
LAB_00131d9d:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zyxc"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131eaa;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_depth,this->_height,this->_width,this->_spectrum);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
    } while (lVar6 < (int)uVar9);
  }
LAB_00131eaa:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zycx"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00131fbb;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_depth,this->_height,this->_spectrum,this->_width);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    lVar5 = 0;
    lVar6 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar13 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + lVar2 * 4;
    } while (lVar6 < (int)uVar9);
  }
LAB_00131fbb:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zcxy"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_001320bf;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_depth,this->_spectrum,this->_width,this->_height);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            lVar5 = 0;
            puVar7 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar6 = 0;
                lVar11 = 0;
                puVar3 = puVar7;
                do {
                  puVar3[res._width * iVar13 + iVar10] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar3 = puVar3 + lVar2;
                  lVar6 = lVar6 + 4;
                } while (lVar11 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar6);
              }
              lVar5 = lVar5 + 1;
              puVar7 = puVar7 + (res._8_8_ & 0xffffffff) * lVar2;
            } while (lVar5 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_001320bf:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "zcyx"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_001321c7;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_depth,this->_spectrum,this->_height,this->_width);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            lVar5 = 0;
            puVar7 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar6 = 0;
                lVar11 = 0;
                puVar3 = puVar7;
                do {
                  puVar3[res._width * iVar13 + iVar10] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar3 = puVar3 + (res._8_8_ & 0xffffffff) * lVar2;
                  lVar6 = lVar6 + 4;
                } while (lVar11 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar6);
              }
              lVar5 = lVar5 + 1;
              puVar7 = puVar7 + lVar2;
            } while (lVar5 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_001321c7:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cxyz"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_001324ef;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
  uVar9 = this->_spectrum;
  switch(uVar9) {
  case 1:
    lVar2 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
    if (lVar2 != 0) {
      puVar7 = this->_data;
      lVar5 = 0;
      do {
        res._data[lVar5] = puVar7[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar2 - lVar5 != 0);
    }
    break;
  case 2:
    lVar2 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
    if (lVar2 != 0) {
      puVar7 = this->_data;
      lVar5 = 0;
      do {
        res._data[lVar5 * 2] = puVar7[lVar5];
        res._data[lVar5 * 2 + 1] = puVar7[lVar2 + lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar2 - lVar5 != 0);
    }
    break;
  case 3:
    lVar2 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
    if (lVar2 != 0) {
      puVar7 = this->_data;
      lVar5 = 0;
      puVar3 = res._data;
      do {
        *puVar3 = puVar7[lVar5];
        puVar3[1] = puVar7[lVar2 + lVar5];
        puVar3[2] = puVar7[lVar2 * 2 + lVar5];
        puVar3 = puVar3 + 3;
        lVar5 = lVar5 + 1;
      } while (lVar2 - lVar5 != 0);
    }
    break;
  case 4:
    lVar2 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
    if (lVar2 != 0) {
      puVar7 = this->_data;
      lVar5 = 0;
      puVar3 = res._data;
      do {
        *puVar3 = puVar7[lVar5];
        puVar3[1] = puVar7[lVar2 + lVar5];
        puVar3[2] = puVar7[lVar2 * 2 + lVar5];
        puVar3[3] = puVar7[lVar2 * 3 + lVar5];
        puVar3 = puVar3 + 4;
        lVar5 = lVar5 + 1;
      } while (lVar2 - lVar5 != 0);
    }
    break;
  default:
    if (0 < (int)uVar9) {
      lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      uVar8 = this->_depth;
      iVar13 = 0;
      do {
        if (0 < (int)uVar8) {
          uVar9 = this->_height;
          lVar5 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar8 = this->_width;
              lVar6 = 0;
              do {
                if (0 < (int)uVar8) {
                  iVar10 = 0;
                  do {
                    uVar9 = *puVar17;
                    puVar17 = puVar17 + 1;
                    res._data[(res._8_8_ & 0xffffffff) * lVar2 * lVar5 +
                              lVar2 * lVar6 + (ulong)(res._width * iVar10 + iVar13)] = uVar9;
                    iVar10 = iVar10 + 1;
                    uVar8 = this->_width;
                  } while (iVar10 < (int)uVar8);
                  uVar9 = this->_height;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < (int)uVar9);
              uVar8 = this->_depth;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (int)uVar8);
          uVar9 = this->_spectrum;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < (int)uVar9);
    }
  }
LAB_001324ef:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cxzy"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_001325f8;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_spectrum,this->_width,this->_depth,this->_height);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar8 = this->_width;
            lVar6 = 0;
            do {
              if (0 < (int)uVar8) {
                iVar10 = 0;
                do {
                  uVar9 = *puVar17;
                  puVar17 = puVar17 + 1;
                  res._data[lVar2 * lVar5 +
                            (res._8_8_ & 0xffffffff) * lVar2 * lVar6 +
                            (ulong)(res._width * iVar10 + iVar13)] = uVar9;
                  iVar10 = iVar10 + 1;
                  uVar8 = this->_width;
                } while (iVar10 < (int)uVar8);
                uVar9 = this->_height;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_001325f8:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cyxz"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00132704;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_spectrum,this->_height,this->_width,this->_depth);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_00132704:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "cyzx"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00132814;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_spectrum,this->_height,this->_depth,this->_width);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        lVar5 = 0;
        lVar6 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            iVar10 = 0;
            do {
              if (0 < (int)uVar16) {
                lVar18 = 0;
                lVar4 = 0;
                lVar11 = (long)res._data + lVar5;
                do {
                  *(uint *)(lVar11 + (ulong)(res._width * iVar10 + iVar13) * 4) = puVar17[lVar4];
                  lVar4 = lVar4 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  lVar11 = lVar11 + (res._8_8_ & 0xffffffff) * lVar2 * 4;
                  lVar18 = lVar18 + 4;
                } while (lVar4 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar18);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)uVar9);
            uVar8 = this->_depth;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + lVar2 * 4;
        } while (lVar6 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_00132814:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "czxy"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00132918;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_spectrum,this->_depth,this->_width,this->_height);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            lVar5 = 0;
            puVar7 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar6 = 0;
                lVar11 = 0;
                puVar3 = puVar7;
                do {
                  puVar3[res._width * iVar10 + iVar13] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar3 = puVar3 + lVar2;
                  lVar6 = lVar6 + 4;
                } while (lVar11 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar6);
              }
              lVar5 = lVar5 + 1;
              puVar7 = puVar7 + (res._8_8_ & 0xffffffff) * lVar2;
            } while (lVar5 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_00132918:
  lVar2 = 0;
  do {
    cVar1 = permut[lVar2];
    cVar12 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar12 = cVar1;
    }
    cVar1 = "czyx"[lVar2];
    cVar15 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar15 = cVar1;
    }
    if (cVar12 != cVar15) {
      if ((int)lVar2 != 4) goto LAB_00132a20;
      break;
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  assign(&res,this->_spectrum,this->_depth,this->_height,this->_width);
  uVar9 = this->_spectrum;
  if (0 < (int)uVar9) {
    lVar2 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
    uVar8 = this->_depth;
    iVar13 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar9 = this->_height;
        iVar10 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar16 = (ulong)this->_width;
            lVar5 = 0;
            puVar7 = res._data;
            do {
              if (0 < (int)uVar16) {
                lVar6 = 0;
                lVar11 = 0;
                puVar3 = puVar7;
                do {
                  puVar3[res._width * iVar10 + iVar13] = puVar17[lVar11];
                  lVar11 = lVar11 + 1;
                  uVar16 = (ulong)(int)this->_width;
                  puVar3 = puVar3 + (res._8_8_ & 0xffffffff) * lVar2;
                  lVar6 = lVar6 + 4;
                } while (lVar11 < (long)uVar16);
                uVar9 = this->_height;
                puVar17 = (uint *)((long)puVar17 + lVar6);
              }
              lVar5 = lVar5 + 1;
              puVar7 = puVar7 + lVar2;
            } while (lVar5 < (int)uVar9);
            uVar8 = this->_depth;
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < (int)uVar8);
        uVar9 = this->_spectrum;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (int)uVar9);
  }
LAB_00132a20:
  if (res._data == (uint *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar14 = "non-";
    if (this->_is_shared != false) {
      pcVar14 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified permutation \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar14,"unsigned int",permut);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  CImg(__return_storage_ptr__,&res);
LAB_00132a35:
  if ((res._is_shared == false) && (res._data != (uint *)0x0)) {
    operator_delete__(res._data);
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return +*this;
      if (!cimg::strncasecmp(permut,"xycz",4)) {
	res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
	res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
	res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
	res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
	res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
	res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
	res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
	res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
	res.assign(_height,_depth,_spectrum,_width);
	switch (_width) {
	case 1 : {
	  t *ptr_r = res.data(0,0,0,0);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++);
	  }
	} break;
	case 2 : {
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
	}
	}
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
	res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
	res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
	res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
	res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
	res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
	res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
	res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
	res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
	res.assign(_spectrum,_width,_height,_depth);
	switch (_spectrum) {
	case 1 : {
	  const T *ptr_r = data(0,0,0,0);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
	} break;
	case 2 : {
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
	}
	}
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
	res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
	res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
	res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
	res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
	res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }